

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * fts5ConfigSkipArgs(char *pIn)

{
  char *pcVar1;
  char *local_18;
  char *p;
  char *pIn_local;
  
  local_18 = pIn;
  while( true ) {
    pcVar1 = fts5ConfigSkipWhitespace(local_18);
    pcVar1 = fts5ConfigSkipLiteral(pcVar1);
    local_18 = fts5ConfigSkipWhitespace(pcVar1);
    if (local_18 == (char *)0x0) {
      return (char *)0x0;
    }
    if (*local_18 == ')') break;
    if (*local_18 != ',') {
      return (char *)0x0;
    }
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

static const char *fts5ConfigSkipArgs(const char *pIn){
  const char *p = pIn;
  
  while( 1 ){
    p = fts5ConfigSkipWhitespace(p);
    p = fts5ConfigSkipLiteral(p);
    p = fts5ConfigSkipWhitespace(p);
    if( p==0 || *p==')' ) break;
    if( *p!=',' ){
      p = 0;
      break;
    }
    p++;
  }

  return p;
}